

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

void opj_cio_close(opj_cio_t *cio)

{
  if (cio != (opj_cio_t *)0x0) {
    if (cio->openmode == 2) {
      free(cio->buffer);
    }
    free(cio);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_cio_close(opj_cio_t *cio) {
	if(cio) {
		if(cio->openmode == OPJ_STREAM_WRITE) {
			/* destroy the allocated buffer */
			opj_free(cio->buffer);
		}
		/* destroy the cio */
		opj_free(cio);
	}
}